

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_test.cpp
# Opt level: O3

void __thiscall
RGBUnboundedSpectrum_MaxValue_Test::TestBody(RGBUnboundedSpectrum_MaxValue_Test *this)

{
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined8 *puVar7;
  undefined8 *puVar8;
  bool bVar9;
  uint uVar10;
  long lVar11;
  byte bVar12;
  uint64_t oldstate_1;
  ulong uVar13;
  ulong uVar14;
  char *message;
  int iVar15;
  uint64_t oldstate;
  ulong uVar16;
  undefined1 auVar17 [16];
  Float FVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Float lambda;
  undefined1 auVar23 [64];
  float fVar24;
  undefined8 in_XMM9_Qa;
  undefined8 in_XMM9_Qb;
  RGBUnboundedSpectrum rs;
  AssertionResult gtest_ar;
  Message local_268;
  float local_260;
  float local_25c;
  RGBUnboundedSpectrum local_258;
  string local_248;
  internal local_228 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  long local_218;
  RGBColorSpace *local_210;
  RGB local_208;
  RGBColorSpace local_1f8;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_138;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_a0;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined1 auStack_70 [64];
  
  puVar7 = pbrt::RGBColorSpace::sRGB;
  local_1f8.r.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)*pbrt::RGBColorSpace::sRGB;
  local_1f8.g.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)pbrt::RGBColorSpace::sRGB[1];
  local_1f8.b.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)pbrt::RGBColorSpace::sRGB[2];
  local_1f8.w.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)pbrt::RGBColorSpace::sRGB[3];
  pvVar1 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
           (pbrt::RGBColorSpace::sRGB + 5);
  local_1f8.illuminant._0_8_ = pbrt::RGBColorSpace::sRGB[4];
  local_248._M_dataplus._M_p = (pointer)pstd::pmr::new_delete_resource();
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)((long)&local_1f8 + 0x28),
             pvVar1,(polymorphic_allocator<float> *)&local_248);
  puVar8 = pbrt::RGBColorSpace::Rec2020;
  local_1f8.XYZFromRGB.m[0]._0_8_ = puVar7[9];
  local_1f8.XYZFromRGB.m._8_8_ = puVar7[10];
  local_1f8.XYZFromRGB.m[1]._4_8_ = puVar7[0xb];
  local_1f8.XYZFromRGB.m[2]._0_8_ = puVar7[0xc];
  local_1f8._104_8_ = puVar7[0xd];
  local_1f8.RGBFromXYZ.m[0]._4_8_ = puVar7[0xe];
  local_1f8.RGBFromXYZ.m[1]._0_8_ = puVar7[0xf];
  local_1f8.RGBFromXYZ.m._20_8_ = puVar7[0x10];
  local_1f8.RGBFromXYZ.m[2]._4_8_ = puVar7[0x11];
  local_1f8.rgbToSpectrumTable = (RGBToSpectrumTable *)puVar7[0x12];
  local_160 = *pbrt::RGBColorSpace::Rec2020;
  uStack_158 = pbrt::RGBColorSpace::Rec2020[1];
  uStack_150 = pbrt::RGBColorSpace::Rec2020[2];
  uStack_148 = pbrt::RGBColorSpace::Rec2020[3];
  pvVar1 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
           (pbrt::RGBColorSpace::Rec2020 + 5);
  local_140 = pbrt::RGBColorSpace::Rec2020[4];
  local_248._M_dataplus._M_p = (pointer)pstd::pmr::new_delete_resource();
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (&local_138,pvVar1,(polymorphic_allocator<float> *)&local_248);
  puVar7 = pbrt::RGBColorSpace::ACES2065_1;
  uStack_118 = puVar8[9];
  uStack_110 = puVar8[10];
  local_108 = puVar8[0xb];
  uStack_100 = puVar8[0xc];
  uStack_f8 = puVar8[0xd];
  uStack_f0 = puVar8[0xe];
  uStack_e8 = puVar8[0xf];
  uStack_e0 = puVar8[0x10];
  uStack_d8 = puVar8[0x11];
  uStack_d0 = puVar8[0x12];
  local_c8 = *pbrt::RGBColorSpace::ACES2065_1;
  uStack_c0 = pbrt::RGBColorSpace::ACES2065_1[1];
  uStack_b8 = pbrt::RGBColorSpace::ACES2065_1[2];
  uStack_b0 = pbrt::RGBColorSpace::ACES2065_1[3];
  pvVar1 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
           (pbrt::RGBColorSpace::ACES2065_1 + 5);
  local_a8 = pbrt::RGBColorSpace::ACES2065_1[4];
  local_248._M_dataplus._M_p = (pointer)pstd::pmr::new_delete_resource();
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (&local_a0,pvVar1,(polymorphic_allocator<float> *)&local_248);
  local_80 = puVar7[9];
  uStack_78 = puVar7[10];
  auStack_70 = *(undefined1 (*) [64])(puVar7 + 0xb);
  uVar16 = 0x853c49e6748fea9b;
  lVar11 = 0;
  do {
    local_210 = (RGBColorSpace *)((long)&local_1f8 + lVar11);
    iVar15 = 0;
    local_218 = lVar11;
    do {
      uVar13 = uVar16 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      uVar14 = uVar13 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      uVar10 = (uint)(uVar14 >> 0x2d) ^ (uint)(uVar14 >> 0x1b);
      bVar12 = (byte)(uVar14 >> 0x3b);
      auVar4._8_8_ = in_XMM9_Qb;
      auVar4._0_8_ = in_XMM9_Qa;
      auVar6 = vcvtusi2ss_avx512f(auVar4,uVar10 >> bVar12 | uVar10 << 0x20 - bVar12);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar13;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar16;
      auVar20 = vpunpcklqdq_avx(auVar22,auVar19);
      auVar3 = vpsrlvq_avx2(auVar20,_DAT_0054e5b0);
      auVar4 = vpsrlvq_avx2(auVar20,_DAT_0054e5c0);
      auVar20 = vpsrlq_avx(auVar20,0x3b);
      auVar17 = vpshufd_avx(auVar20,0xe8);
      auVar20 = vminss_avx(ZEXT416((uint)(auVar6._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
      local_208.b = auVar20._0_4_ * 10.0;
      auVar20 = vpshufd_avx(auVar3 ^ auVar4,0xe8);
      auVar20 = vprorvd_avx512vl(auVar20,auVar17);
      auVar17 = vcvtudq2ps_avx512vl(auVar20);
      auVar20._8_4_ = 0x2f800000;
      auVar20._0_8_ = 0x2f8000002f800000;
      auVar20._12_4_ = 0x2f800000;
      auVar20 = vmulps_avx512vl(auVar17,auVar20);
      auVar17._8_4_ = 0x3f7fffff;
      auVar17._0_8_ = 0x3f7fffff3f7fffff;
      auVar17._12_4_ = 0x3f7fffff;
      auVar20 = vminps_avx512vl(auVar20,auVar17);
      auVar3._8_4_ = 0x41200000;
      auVar3._0_8_ = 0x4120000041200000;
      auVar3._12_4_ = 0x41200000;
      auVar20 = vmulps_avx512vl(auVar20,auVar3);
      local_208._0_8_ = vmovlps_avx(auVar20);
      pbrt::RGBUnboundedSpectrum::RGBUnboundedSpectrum(&local_258,local_210,&local_208);
      local_260 = local_258.scale;
      FVar18 = pbrt::RGBSigmoidPolynomial::MaxValue(&local_258.rsp);
      auVar23 = ZEXT464(0x43b40000);
      auVar20 = ZEXT816(0) << 0x40;
      uVar16 = uVar14 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      do {
        auVar17 = vfmadd213ss_fma(ZEXT416((uint)local_258.rsp.c0),auVar23._0_16_,
                                  ZEXT416((uint)local_258.rsp.c1));
        auVar17 = vfmadd213ss_fma(auVar17,auVar23._0_16_,ZEXT416((uint)local_258.rsp.c2));
        if (ABS(auVar17._0_4_) == INFINITY) {
          uVar5 = vcmpss_avx512f(auVar17,ZEXT416(0),0xe);
          fVar24 = (float)((uint)((byte)uVar5 & 1) * 0x3f800000);
        }
        else {
          auVar3 = vfmadd213ss_fma(auVar17,auVar17,ZEXT416(0x3f800000));
          auVar3 = vsqrtss_avx(auVar3,auVar3);
          fVar24 = auVar17._0_4_ / (auVar3._0_4_ + auVar3._0_4_) + 0.5;
        }
        fVar2 = auVar23._0_4_ + 0.0625;
        auVar23 = ZEXT464((uint)fVar2);
        auVar20 = vmaxss_avx(ZEXT416((uint)(local_258.scale * fVar24)),auVar20);
      } while (fVar2 <= 830.0);
      local_25c = FVar18 * local_260;
      local_260 = auVar20._0_4_;
      local_248._M_dataplus._M_p = &DAT_3f1a36e2eb1c432d;
      auVar21._0_4_ = (local_260 - local_25c) / local_260;
      auVar21._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar6._8_4_ = 0x7fffffff;
      auVar6._0_8_ = 0x7fffffff7fffffff;
      auVar6._12_4_ = 0x7fffffff;
      auVar20 = vandps_avx512vl(auVar21,auVar6);
      local_268.ss_.ptr_._0_4_ = auVar20._0_4_;
      testing::internal::CmpHelperLT<float,double>
                (local_228,"std::abs((sm - m) / sm)","1e-4",(float *)&local_268,(double *)&local_248
                );
      if (local_228[0] == (internal)0x0) {
        testing::Message::Message(&local_268);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_268.ss_.ptr_._4_4_,local_268.ss_.ptr_._0_4_) + 0x10),
                   "sampled ",8);
        std::ostream::_M_insert<double>((double)local_260);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_268.ss_.ptr_._4_4_,local_268.ss_.ptr_._0_4_) + 0x10),
                   " MaxValue ",10);
        std::ostream::_M_insert<double>((double)local_25c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_268.ss_.ptr_._4_4_,local_268.ss_.ptr_._0_4_) + 0x10),
                   " for ",5);
        lVar11 = CONCAT44(local_268.ss_.ptr_._4_4_,local_268.ss_.ptr_._0_4_);
        pbrt::RGBUnboundedSpectrum::ToString_abi_cxx11_(&local_248,&local_258);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(lVar11 + 0x10),local_248._M_dataplus._M_p,local_248._M_string_length)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        message = "";
        if (local_220.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((local_220.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_248,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/color_test.cpp"
                   ,0x68,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,&local_268);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
        if (CONCAT44(local_268.ss_.ptr_._4_4_,local_268.ss_.ptr_._0_4_) != 0) {
          bVar9 = testing::internal::IsTrue(true);
          if ((bVar9) &&
             ((long *)CONCAT44(local_268.ss_.ptr_._4_4_,local_268.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_268.ss_.ptr_._4_4_,local_268.ss_.ptr_._0_4_) + 8))
                      ();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_220,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      iVar15 = iVar15 + 1;
    } while (iVar15 != 100);
    lVar11 = local_218 + 0x98;
  } while (lVar11 != 0x1c8);
  lVar11 = 0x158;
  do {
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
               ((long)&local_1f8 + lVar11));
    lVar11 = lVar11 + -0x98;
  } while (lVar11 != -0x70);
  return;
}

Assistant:

TEST(RGBUnboundedSpectrum, MaxValue) {
    RNG rng;
    for (const auto &cs :
         {*RGBColorSpace::sRGB, *RGBColorSpace::Rec2020, *RGBColorSpace::ACES2065_1}) {
        for (int i = 0; i < 100; ++i) {
            RGB rgb(rng.Uniform<Float>(), rng.Uniform<Float>(), rng.Uniform<Float>());
            rgb *= 10.f;
            RGBUnboundedSpectrum rs(cs, rgb);

            Float m = rs.MaxValue();
            Float sm = 0;
            for (Float lambda = 360; lambda <= 830; lambda += 1. / 16.)
                sm = std::max(sm, rs(lambda));
            EXPECT_LT(std::abs((sm - m) / sm), 1e-4)
                << "sampled " << sm << " MaxValue " << m << " for " << rs;
        }
    }
}